

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void * __thiscall jpgd::jpeg_decoder::alloc(jpeg_decoder *this,size_t nSize,bool zero)

{
  mem_block **ppmVar1;
  ulong uVar2;
  uint uVar3;
  mem_block *pmVar4;
  mem_block *pmVar5;
  ulong __n;
  size_t sVar6;
  
  __n = nSize + 3 + (ulong)(nSize == 0) & 0xfffffffffffffffc;
  ppmVar1 = &this->m_pMem_blocks;
  pmVar4 = (mem_block *)ppmVar1;
  do {
    pmVar4 = pmVar4->m_pNext;
    if (pmVar4 == (mem_block *)0x0) {
      uVar3 = (int)__n + 0x7ffU & 0xfffff800;
      sVar6 = 0x7f00;
      if (0x7f00 < (int)uVar3) {
        sVar6 = (size_t)uVar3;
      }
      pmVar5 = (mem_block *)malloc(sVar6 + 0x20);
      if (pmVar5 == (mem_block *)0x0) {
        stop_decoding(this,JPGD_NOTENOUGHMEM);
      }
      pmVar5->m_pNext = *ppmVar1;
      *ppmVar1 = pmVar5;
      pmVar5->m_used_count = __n;
      pmVar5->m_size = sVar6;
      goto LAB_0013ff4d;
    }
    uVar2 = pmVar4->m_used_count + __n;
  } while (pmVar4->m_size < uVar2);
  pmVar5 = (mem_block *)(pmVar4->m_data + (pmVar4->m_used_count - 0x18));
  pmVar4->m_used_count = uVar2;
LAB_0013ff4d:
  if (zero) {
    memset(pmVar5->m_data,0,__n);
  }
  return pmVar5->m_data;
}

Assistant:

void* jpeg_decoder::alloc(size_t nSize, bool zero)
	{
		nSize = (JPGD_MAX(nSize, 1) + 3) & ~3;
		char* rv = nullptr;
		for (mem_block* b = m_pMem_blocks; b; b = b->m_pNext)
		{
			if ((b->m_used_count + nSize) <= b->m_size)
			{
				rv = b->m_data + b->m_used_count;
				b->m_used_count += nSize;
				break;
			}
		}
		if (!rv)
		{
			int capacity = JPGD_MAX(32768 - 256, ((int)nSize + 2047) & ~2047);
			mem_block* b = (mem_block*)jpgd_malloc(sizeof(mem_block) + capacity);
			if (!b)
			{
				stop_decoding(JPGD_NOTENOUGHMEM);
			}

			b->m_pNext = m_pMem_blocks;
			m_pMem_blocks = b;
			b->m_used_count = nSize;
			b->m_size = capacity;
			rv = b->m_data;
		}
		if (zero) memset(rv, 0, nSize);
		return rv;
	}